

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btcp.c
# Opt level: O3

void nn_btcp_start_listening(nn_btcp *self)

{
  nn_usock *self_00;
  int iVar1;
  int iVar2;
  nn_fsm *owner;
  char *pcVar3;
  size_t sVar4;
  nn_atcp *self_01;
  nn_fsm *self_02;
  int ipv4only;
  size_t ipv4onlylen;
  int local_cc;
  size_t local_c8;
  size_t local_c0;
  sockaddr_storage local_b8;
  
  owner = (nn_fsm *)nn_epbase_getaddr(&self->epbase);
  local_b8.ss_family = 0;
  local_b8.__ss_padding[0] = '\0';
  local_b8.__ss_padding[1] = '\0';
  local_b8.__ss_padding[2] = '\0';
  local_b8.__ss_padding[3] = '\0';
  local_b8.__ss_padding[4] = '\0';
  local_b8.__ss_padding[5] = '\0';
  local_b8.__ss_padding[6] = '\0';
  local_b8.__ss_padding[7] = '\0';
  local_b8.__ss_padding[8] = '\0';
  local_b8.__ss_padding[9] = '\0';
  local_b8.__ss_padding[10] = '\0';
  local_b8.__ss_padding[0xb] = '\0';
  local_b8.__ss_padding[0xc] = '\0';
  local_b8.__ss_padding[0xd] = '\0';
  local_b8.__ss_padding[0xe] = '\0';
  local_b8.__ss_padding[0xf] = '\0';
  local_b8.__ss_padding[0x10] = '\0';
  local_b8.__ss_padding[0x11] = '\0';
  local_b8.__ss_padding[0x12] = '\0';
  local_b8.__ss_padding[0x13] = '\0';
  local_b8.__ss_padding[0x14] = '\0';
  local_b8.__ss_padding[0x15] = '\0';
  local_b8.__ss_padding[0x16] = '\0';
  local_b8.__ss_padding[0x17] = '\0';
  local_b8.__ss_padding[0x18] = '\0';
  local_b8.__ss_padding[0x19] = '\0';
  local_b8.__ss_padding[0x1a] = '\0';
  local_b8.__ss_padding[0x1b] = '\0';
  local_b8.__ss_padding[0x1c] = '\0';
  local_b8.__ss_padding[0x1d] = '\0';
  local_b8.__ss_padding[0x1e] = '\0';
  local_b8.__ss_padding[0x1f] = '\0';
  local_b8.__ss_padding[0x20] = '\0';
  local_b8.__ss_padding[0x21] = '\0';
  local_b8.__ss_padding[0x22] = '\0';
  local_b8.__ss_padding[0x23] = '\0';
  local_b8.__ss_padding[0x24] = '\0';
  local_b8.__ss_padding[0x25] = '\0';
  local_b8.__ss_padding[0x26] = '\0';
  local_b8.__ss_padding[0x27] = '\0';
  local_b8.__ss_padding[0x28] = '\0';
  local_b8.__ss_padding[0x29] = '\0';
  local_b8.__ss_padding[0x2a] = '\0';
  local_b8.__ss_padding[0x2b] = '\0';
  local_b8.__ss_padding[0x2c] = '\0';
  local_b8.__ss_padding[0x2d] = '\0';
  local_b8.__ss_padding[0x2e] = '\0';
  local_b8.__ss_padding[0x2f] = '\0';
  local_b8.__ss_padding[0x30] = '\0';
  local_b8.__ss_padding[0x31] = '\0';
  local_b8.__ss_padding[0x32] = '\0';
  local_b8.__ss_padding[0x33] = '\0';
  local_b8.__ss_padding[0x34] = '\0';
  local_b8.__ss_padding[0x35] = '\0';
  local_b8.__ss_padding[0x36] = '\0';
  local_b8.__ss_padding[0x37] = '\0';
  local_b8.__ss_padding[0x38] = '\0';
  local_b8.__ss_padding[0x39] = '\0';
  local_b8.__ss_padding[0x3a] = '\0';
  local_b8.__ss_padding[0x3b] = '\0';
  local_b8.__ss_padding[0x3c] = '\0';
  local_b8.__ss_padding[0x3d] = '\0';
  local_b8.__ss_padding[0x3e] = '\0';
  local_b8.__ss_padding[0x3f] = '\0';
  local_b8.__ss_padding[0x40] = '\0';
  local_b8.__ss_padding[0x41] = '\0';
  local_b8.__ss_padding[0x42] = '\0';
  local_b8.__ss_padding[0x43] = '\0';
  local_b8.__ss_padding[0x44] = '\0';
  local_b8.__ss_padding[0x45] = '\0';
  local_b8.__ss_padding[0x46] = '\0';
  local_b8.__ss_padding[0x47] = '\0';
  local_b8.__ss_padding[0x48] = '\0';
  local_b8.__ss_padding[0x49] = '\0';
  local_b8.__ss_padding[0x4a] = '\0';
  local_b8.__ss_padding[0x4b] = '\0';
  local_b8.__ss_padding[0x4c] = '\0';
  local_b8.__ss_padding[0x4d] = '\0';
  local_b8.__ss_padding[0x4e] = '\0';
  local_b8.__ss_padding[0x4f] = '\0';
  local_b8.__ss_padding[0x50] = '\0';
  local_b8.__ss_padding[0x51] = '\0';
  local_b8.__ss_padding[0x52] = '\0';
  local_b8.__ss_padding[0x53] = '\0';
  local_b8.__ss_padding[0x54] = '\0';
  local_b8.__ss_padding[0x55] = '\0';
  local_b8.__ss_padding[0x56] = '\0';
  local_b8.__ss_padding[0x57] = '\0';
  local_b8.__ss_padding[0x58] = '\0';
  local_b8.__ss_padding[0x59] = '\0';
  local_b8.__ss_padding[0x5a] = '\0';
  local_b8.__ss_padding[0x5b] = '\0';
  local_b8.__ss_padding[0x5c] = '\0';
  local_b8.__ss_padding[0x5d] = '\0';
  local_b8.__ss_padding[0x5e] = '\0';
  local_b8.__ss_padding[0x5f] = '\0';
  local_b8.__ss_padding[0x60] = '\0';
  local_b8.__ss_padding[0x61] = '\0';
  local_b8.__ss_padding[0x62] = '\0';
  local_b8.__ss_padding[99] = '\0';
  local_b8.__ss_padding[100] = '\0';
  local_b8.__ss_padding[0x65] = '\0';
  local_b8.__ss_padding[0x66] = '\0';
  local_b8.__ss_padding[0x67] = '\0';
  local_b8.__ss_padding[0x68] = '\0';
  local_b8.__ss_padding[0x69] = '\0';
  local_b8.__ss_padding[0x6a] = '\0';
  local_b8.__ss_padding[0x6b] = '\0';
  local_b8.__ss_padding[0x6c] = '\0';
  local_b8.__ss_padding[0x6d] = '\0';
  local_b8.__ss_padding[0x6e] = '\0';
  local_b8.__ss_padding[0x6f] = '\0';
  local_b8.__ss_padding[0x70] = '\0';
  local_b8.__ss_padding[0x71] = '\0';
  local_b8.__ss_padding[0x72] = '\0';
  local_b8.__ss_padding[0x73] = '\0';
  local_b8.__ss_padding[0x74] = '\0';
  local_b8.__ss_padding[0x75] = '\0';
  local_b8.__ss_align = 0;
  pcVar3 = strrchr((char *)owner,0x3a);
  if (pcVar3 == (char *)0x0) {
    nn_btcp_start_listening_cold_5();
LAB_0012c0ee:
    nn_btcp_start_listening_cold_4();
LAB_0012c0f3:
    nn_btcp_start_listening_cold_1();
  }
  else {
    sVar4 = strlen((char *)owner);
    pcVar3 = pcVar3 + 1;
    iVar1 = nn_port_resolve(pcVar3,(size_t)((long)owner + (sVar4 - (long)pcVar3)));
    if (iVar1 < 0) goto LAB_0012c0ee;
    local_c0 = 4;
    nn_epbase_getopt(&self->epbase,0,0xe,&local_cc,&local_c0);
    if (local_c0 != 4) goto LAB_0012c0f3;
    iVar2 = nn_iface_resolve((char *)owner,(size_t)(pcVar3 + ~(ulong)owner),local_cc,&local_b8,
                             &local_c8);
    if (iVar2 == 0) {
      local_c8 = 0x10;
      if (local_b8.ss_family != 2) {
        if (local_b8.ss_family != 10) {
          nn_btcp_start_listening_cold_3();
          if (owner[8].owner == (nn_fsm *)0x0) {
            self_02 = (nn_fsm *)0x740;
            self_01 = (nn_atcp *)nn_alloc_(0x740);
            owner[8].owner = (nn_fsm *)self_01;
            if (self_01 != (nn_atcp *)0x0) {
              nn_atcp_init(self_01,2,(nn_epbase *)&owner[1].shutdown_fn,owner);
              nn_atcp_start((nn_atcp *)owner[8].owner,(nn_usock *)&owner[1].srcptr);
              return;
            }
          }
          else {
            nn_btcp_start_accepting_cold_1();
            self_02 = owner;
          }
          nn_btcp_start_accepting_cold_2();
          if (self_02 != (nn_fsm *)0x0) {
            self_02 = (nn_fsm *)&self_02[-2].stopped.item;
          }
          nn_fsm_stop(self_02);
          return;
        }
        local_c8 = 0x1c;
      }
      local_b8.__ss_padding._0_2_ = (ushort)iVar1 << 8 | (ushort)iVar1 >> 8;
      self_00 = &self->usock;
      iVar1 = nn_usock_start(self_00,(uint)local_b8.ss_family,1,0);
      if (-1 < iVar1) {
        iVar1 = nn_usock_bind(self_00,(sockaddr *)&local_b8,local_c8);
        if ((-1 < iVar1) && (iVar1 = nn_usock_listen(self_00,100), -1 < iVar1)) {
          nn_btcp_start_accepting(self);
          self->state = 2;
          return;
        }
        nn_usock_stop(self_00);
        self->state = 8;
        return;
      }
      goto LAB_0012c0ff;
    }
  }
  nn_btcp_start_listening_cold_2();
LAB_0012c0ff:
  nn_backoff_start(&self->retry);
  self->state = 7;
  return;
}

Assistant:

static void nn_btcp_start_listening (struct nn_btcp *self)
{
    int rc;
    struct sockaddr_storage ss;
    size_t sslen;
    int ipv4only;
    size_t ipv4onlylen;
    const char *addr;
    const char *end;
    const char *pos;
    uint16_t port;

    /*  First, resolve the IP address. */
    addr = nn_epbase_getaddr (&self->epbase);
    memset (&ss, 0, sizeof (ss));

    /*  Parse the port. */
    end = addr + strlen (addr);
    pos = strrchr (addr, ':');
    nn_assert (pos);
    ++pos;
    rc = nn_port_resolve (pos, end - pos);
    nn_assert (rc >= 0);
    port = rc;

    /*  Parse the address. */
    ipv4onlylen = sizeof (ipv4only);
    nn_epbase_getopt (&self->epbase, NN_SOL_SOCKET, NN_IPV4ONLY,
        &ipv4only, &ipv4onlylen);
    nn_assert (ipv4onlylen == sizeof (ipv4only));
    rc = nn_iface_resolve (addr, pos - addr - 1, ipv4only, &ss, &sslen);
    errnum_assert (rc == 0, -rc);

    /*  Combine the port and the address. */
    if (ss.ss_family == AF_INET) {
        ((struct sockaddr_in*) &ss)->sin_port = htons (port);
        sslen = sizeof (struct sockaddr_in);
    }
    else if (ss.ss_family == AF_INET6) {
        ((struct sockaddr_in6*) &ss)->sin6_port = htons (port);
        sslen = sizeof (struct sockaddr_in6);
    }
    else
        nn_assert (0);

    /*  Start listening for incoming connections. */
    rc = nn_usock_start (&self->usock, ss.ss_family, SOCK_STREAM, 0);
    if (nn_slow (rc < 0)) {
        nn_backoff_start (&self->retry);
        self->state = NN_BTCP_STATE_WAITING;
        return;
    }

    rc = nn_usock_bind (&self->usock, (struct sockaddr*) &ss, (size_t) sslen);
    if (nn_slow (rc < 0)) {
        nn_usock_stop (&self->usock);
        self->state = NN_BTCP_STATE_CLOSING;
        return;
    }

    rc = nn_usock_listen (&self->usock, NN_BTCP_BACKLOG);
    if (nn_slow (rc < 0)) {
        nn_usock_stop (&self->usock);
        self->state = NN_BTCP_STATE_CLOSING;
        return;
    }
    nn_btcp_start_accepting(self);
    self->state = NN_BTCP_STATE_ACTIVE;
}